

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

CheckedError __thiscall flatbuffers::Parser::DoParseJson(Parser *this)

{
  FlatBufferBuilderImpl<false> *this_00;
  _Base_ptr p_Var1;
  CheckedError *ce;
  StructDef *in_RSI;
  allocator<char> local_31;
  uoffset_t toff;
  
  if (*(int *)((long)&(in_RSI->super_Definition).name.field_2 + 0xc) == 0x7b) {
    p_Var1 = *(_Base_ptr *)
              ((long)&in_RSI[2].super_Definition.attributes.dict._M_t._M_impl.super__Rb_tree_header.
                      _M_header + 8);
    if (p_Var1 == (_Base_ptr)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&toff,"no root type set to parse json with",&local_31);
      Error(this,(string *)in_RSI);
    }
    else {
      if (in_RSI[1].super_Definition.serialized_location == 0) {
        ParseTable(this,in_RSI,(string *)p_Var1,(uoffset_t *)0x0);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00115467;
        CheckedError::~CheckedError((CheckedError *)this);
        p_Var1 = *(_Base_ptr *)
                  ((long)&in_RSI[2].super_Definition.attributes.dict._M_t._M_impl.
                          super__Rb_tree_header._M_header + 0x18);
        if (p_Var1 != (_Base_ptr)0x0) {
          p_Var1 = *(_Base_ptr *)
                    ((long)&in_RSI[2].super_Definition.attributes.dict._M_t._M_impl.
                            super__Rb_tree_header._M_header + 0x10);
        }
        this_00 = (FlatBufferBuilderImpl<false> *)
                  &in_RSI[1].super_Definition.attributes.dict._M_t._M_impl.super__Rb_tree_header.
                   _M_node_count;
        if (*(char *)((long)&in_RSI[4].super_Definition.file._M_string_length + 1) == '\x01') {
          FlatBufferBuilderImpl<false>::FinishSizePrefixed<flatbuffers::Table>
                    (this_00,(Offset<flatbuffers::Table>)toff,(char *)p_Var1);
        }
        else {
          FlatBufferBuilderImpl<false>::Finish<flatbuffers::Table>
                    (this_00,(Offset<flatbuffers::Table>)toff,(char *)p_Var1);
        }
        goto LAB_00115406;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&toff,"cannot have more than one json object in a file",&local_31);
      Error(this,(string *)in_RSI);
    }
    std::__cxx11::string::~string((string *)&toff);
  }
  else {
    Expect(this,(int)in_RSI);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00115467;
    CheckedError::~CheckedError((CheckedError *)this);
LAB_00115406:
    if (*(char *)&in_RSI[4].original_location._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl == '\x01') {
      Expect(this,(int)in_RSI);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00115467;
      CheckedError::~CheckedError((CheckedError *)this);
    }
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
LAB_00115467:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::DoParseJson() {
  if (token_ != '{') {
    EXPECT('{');
  } else {
    if (!root_struct_def_) return Error("no root type set to parse json with");
    if (builder_.GetSize()) {
      return Error("cannot have more than one json object in a file");
    }
    uoffset_t toff;
    ECHECK(ParseTable(*root_struct_def_, nullptr, &toff));
    if (opts.size_prefixed) {
      builder_.FinishSizePrefixed(
          Offset<Table>(toff),
          file_identifier_.length() ? file_identifier_.c_str() : nullptr);
    } else {
      builder_.Finish(Offset<Table>(toff), file_identifier_.length()
                                               ? file_identifier_.c_str()
                                               : nullptr);
    }
  }
  if (opts.require_json_eof) {
    // Check that JSON file doesn't contain more objects or IDL directives.
    // Comments after JSON are allowed.
    EXPECT(kTokenEof);
  }
  return NoError();
}